

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb_tests.cpp
# Opt level: O0

void __thiscall
wallet::walletdb_tests::walletdb_readkeyvalue::test_method(walletdb_readkeyvalue *this)

{
  long lVar1;
  long in_FS_OFFSET;
  failure *ex;
  DataStream ssValue;
  uint256 dummy;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>
  *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  undefined6 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 in_stack_fffffffffffffe6f;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  lazy_ostream *in_stack_fffffffffffffe88;
  const_string *in_stack_fffffffffffffe90;
  const_string *this_00;
  const_string local_d0;
  lazy_ostream local_c0 [2];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::DataStream((DataStream *)in_stack_fffffffffffffe58);
  uint256::uint256((uint256 *)in_stack_fffffffffffffe58);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffe6f,
                        CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)),
               (pointer)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
               (unsigned_long)in_stack_fffffffffffffe58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,in_stack_fffffffffffffe90,
               (size_t)in_stack_fffffffffffffe88,
               (const_string *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    DataStream::operator>>
              ((DataStream *)
               CONCAT17(in_stack_fffffffffffffe6f,
                        CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)),
               (uint256 *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    do {
      in_stack_fffffffffffffe90 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffe6f,
                          CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)),
                 (pointer)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                 (unsigned_long)in_stack_fffffffffffffe58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)this_00,in_stack_fffffffffffffe90,
                 (size_t)in_stack_fffffffffffffe88,
                 (const_string *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)
                 CONCAT17(in_stack_fffffffffffffe6f,
                          CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)),
                 (bool)in_stack_fffffffffffffe67);
      in_stack_fffffffffffffe88 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                 (char (*) [57])in_stack_fffffffffffffe58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffe6f,
                          CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)),
                 (pointer)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                 (unsigned_long)in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe58 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]> *)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&stack0xffffffffffffff60,local_c0,&local_d0,0x1d,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>::
      ~lazy_ostream_impl(in_stack_fffffffffffffe58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe87 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffe87);
    in_stack_fffffffffffffe6e = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffe6e);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffffe58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(walletdb_readkeyvalue)
{
    /**
     * When ReadKeyValue() reads from either a "key" or "wkey" it first reads the DataStream into a
     * CPrivKey or CWalletKey respectively and then reads a hash of the pubkey and privkey into a uint256.
     * Wallets from 0.8 or before do not store the pubkey/privkey hash, trying to read the hash from old
     * wallets throws an exception, for backwards compatibility this read is wrapped in a try block to
     * silently fail. The test here makes sure the type of exception thrown from DataStream::read()
     * matches the type we expect, otherwise we need to update the "key"/"wkey" exception type caught.
     */
    DataStream ssValue{};
    uint256 dummy;
    BOOST_CHECK_THROW(ssValue >> dummy, std::ios_base::failure);
}